

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void ctemplate::StripTemplateWhiteSpace(char **str,size_t *len)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  
  sVar3 = *len;
  while ((sVar3 = sVar3 - 1, sVar3 != 0xffffffffffffffff &&
         (bVar2 = ascii_isspace((*str)[sVar3]), bVar2))) {
    *len = sVar3;
  }
  while( true ) {
    if (sVar3 == 0xffffffffffffffff) {
      return;
    }
    pcVar1 = *str;
    bVar2 = ascii_isspace(*pcVar1);
    if (!bVar2) break;
    *len = sVar3;
    *str = pcVar1 + 1;
    sVar3 = sVar3 - 1;
  }
  return;
}

Assistant:

static void StripTemplateWhiteSpace(const char** str, size_t* len) {
  // Strip off trailing whitespace.
  while ((*len) > 0 && ascii_isspace((*str)[(*len)-1])) {
    (*len)--;
  }

  // Strip off leading whitespace.
  while ((*len) > 0 && ascii_isspace((*str)[0])) {
    (*len)--;
    (*str)++;
  }
}